

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

string cs_impl::cxx_demangle_abi_cxx11_(char *name)

{
  char *pcVar1;
  char *in_RSI;
  proxy *in_RDI;
  char *ret;
  int status;
  size_t size;
  char buffer [1024];
  allocator local_445 [20];
  allocator local_431;
  char *local_430;
  undefined1 local_424 [4];
  undefined8 local_420;
  undefined1 local_418 [1032];
  char *local_10;
  
  local_10 = in_RSI;
  memset(local_418,0,0x400);
  local_420 = 0x400;
  pcVar1 = (char *)__cxa_demangle(local_10,local_418,&local_420,local_424);
  local_430 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_10,local_445);
    std::allocator<char>::~allocator((allocator<char> *)local_445);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_431);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
  }
  return (string)in_RDI;
}

Assistant:

std::string cxx_demangle(const char *name)
	{
		char buffer[1024] = {0};
		size_t size = sizeof(buffer);
		int status;
		char *ret = abi::__cxa_demangle(name, buffer, &size, &status);
		if (ret != nullptr)
			return std::string(ret);
		else
			return name;
	}